

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.cpp
# Opt level: O0

void __thiscall OpenMD::BendStamp::BendStamp(BendStamp *this)

{
  undefined8 *in_RDI;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  value_type *in_stack_ffffffffffffff08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_89;
  string local_88 [79];
  undefined1 local_39 [57];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  *in_RDI = &PTR__BendStamp_005008b8;
  Parameter<int>::Parameter
            ((Parameter<int> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x312c86);
  *(undefined1 *)(in_RDI + 0x16) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x17));
  __a = (allocator<char> *)(in_RDI + 0x1b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x312cb9);
  __s = (char *)(in_RDI + 0xd);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_ffffffffffffff08->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_ffffffffffffff08);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x312dd5);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

BendStamp::BendStamp() : hasOverride_(false) {
    DefineOptionalParameter(GhostVectorSource, "ghostVectorSource");
  }